

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

QPDF_ERROR_CODE qpdf_init_write_memory(qpdf_data qpdf)

{
  qpdf_data qpdf_00;
  QPDF_ERROR_CODE QVar1;
  _func_void__qpdf_data_ptr *local_40;
  function<void_(_qpdf_data_*)> local_38;
  QPDF_ERROR_CODE local_14;
  qpdf_data p_Stack_10;
  QPDF_ERROR_CODE status;
  qpdf_data qpdf_local;
  
  p_Stack_10 = qpdf;
  qpdf_init_write_internal(qpdf);
  qpdf_00 = p_Stack_10;
  local_40 = call_init_write_memory;
  std::function<void(_qpdf_data*)>::function<void(*)(_qpdf_data*),void>
            ((function<void(_qpdf_data*)> *)&local_38,&local_40);
  QVar1 = trap_errors(qpdf_00,&local_38);
  std::function<void_(_qpdf_data_*)>::~function(&local_38);
  local_14 = QVar1;
  QTC::TC("qpdf","qpdf-c called qpdf_init_write_memory",0);
  p_Stack_10->write_memory = true;
  return local_14;
}

Assistant:

QPDF_ERROR_CODE
qpdf_init_write_memory(qpdf_data qpdf)
{
    qpdf_init_write_internal(qpdf);
    QPDF_ERROR_CODE status = trap_errors(qpdf, &call_init_write_memory);
    QTC::TC("qpdf", "qpdf-c called qpdf_init_write_memory");
    qpdf->write_memory = true;
    return status;
}